

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::PlaTask::~PlaTask(PlaTask *this)

{
  SystemSubroutine::~SystemSubroutine((SystemSubroutine *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

PlaTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {}